

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

void enumerate_bbs(gen_ctx_t gen_ctx)

{
  bb_t_conflict bb;
  size_t len;
  bb_t pbVar1;
  size_t pre;
  size_t rpost;
  size_t local_10;
  size_t local_8;
  
  bb = (gen_ctx->curr_cfg->bbs).head;
  for (pbVar1 = bb; pbVar1 != (bb_t_conflict)0x0; pbVar1 = (pbVar1->bb_link).next) {
    pbVar1->pre = 0;
    pbVar1->rpost = 0;
  }
  local_10 = 1;
  local_8 = 0;
  for (pbVar1 = bb; pbVar1 != (bb_t_conflict)0x0; pbVar1 = (pbVar1->bb_link).next) {
    local_8 = local_8 + 1;
  }
  DFS(bb,&local_10,&local_8);
  return;
}

Assistant:

static void enumerate_bbs (gen_ctx_t gen_ctx) {
  size_t pre, rpost;

  for (bb_t bb = DLIST_HEAD (bb_t, curr_cfg->bbs); bb != NULL; bb = DLIST_NEXT (bb_t, bb))
    bb->pre = bb->rpost = 0;
  pre = 1;
  rpost = DLIST_LENGTH (bb_t, curr_cfg->bbs);
  DFS (DLIST_HEAD (bb_t, curr_cfg->bbs), &pre, &rpost);
}